

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_combo_begin_image_text(nk_context *ctx,char *selected,int len,nk_image img,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_symbol_type type;
  nk_window *win;
  nk_rect r;
  nk_widget_layout_states nVar2;
  nk_bool nVar3;
  long lVar4;
  nk_context *i;
  nk_style_combo *pnVar5;
  nk_bool nVar6;
  nk_color c;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect b;
  nk_rect header_00;
  float local_e8;
  float fStack_e4;
  float local_d8;
  nk_text local_b8;
  nk_rect button;
  nk_rect header;
  nk_rect local_40;
  
  nVar6 = 0;
  nVar3 = 0;
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, nVar3 = nVar6, win != (nk_window *)0x0))
     && (win->layout != (nk_panel *)0x0)) {
    nVar2 = nk_widget(&header,ctx);
    if (nVar2 != NK_WIDGET_INVALID) {
      i = ctx;
      if ((win->layout->flags & 0x1000) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar2 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      r.w = header.w;
      r.h = header.h;
      r.x = header.x;
      r.y = header.y;
      fVar9 = header.h;
      nVar3 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      if ((ctx->last_widget_state & 0x20) == 0) {
        if ((ctx->last_widget_state & 0x10) == 0) {
          pnVar5 = &(ctx->style).combo;
          local_b8.text = (ctx->style).combo.label_normal;
        }
        else {
          pnVar5 = (nk_style_combo *)&(ctx->style).combo.hover;
          local_b8.text = (ctx->style).combo.label_hover;
        }
      }
      else {
        pnVar5 = (nk_style_combo *)&(ctx->style).combo.active;
        local_b8.text = (ctx->style).combo.label_active;
      }
      if ((pnVar5->normal).type == NK_STYLE_ITEM_IMAGE) {
        r_00.w = header.w;
        r_00.h = header.h;
        r_00.x = header.x;
        r_00.y = header.y;
        nk_draw_image(&win->buffer,r_00,&(pnVar5->normal).data.image,(nk_color)0xffffffff);
        c.r = '\0';
        c.g = '\0';
        c.b = '\0';
        c.a = '\0';
      }
      else {
        c = (pnVar5->normal).data.color;
        rect.w = header.w;
        rect.h = header.h;
        rect.x = header.x;
        rect.y = header.y;
        nk_fill_rect(&win->buffer,rect,(ctx->style).combo.rounding,c);
        rect_00.w = header.w;
        rect_00.h = header.h;
        rect_00.x = header.x;
        rect_00.y = header.y;
        nk_stroke_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar4 = 0x1be4;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar4 = (ulong)(nVar3 != 0) * 8 + 0x1be0;
      }
      type = *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar4);
      fVar7 = (ctx->style).combo.button_padding.y;
      local_e8 = header.x;
      fStack_e4 = header.y;
      button.y = fStack_e4 + fVar7;
      button.w = fVar9 - (fVar7 + fVar7);
      local_d8 = header.w;
      fVar10 = ((local_e8 + local_d8) - fVar9) - (ctx->style).combo.button_padding.x;
      nVar1 = (ctx->style).combo.button.padding;
      fVar7 = nVar1.x;
      fVar8 = nVar1.y;
      local_40.x = fVar10 + fVar7;
      local_40.y = button.y + fVar8;
      local_40.w = button.w - (fVar7 + fVar7);
      local_40.h = button.w - (fVar8 + fVar8);
      fVar7 = local_e8 + local_d8;
      local_b8.background = c;
      button.x = fVar10;
      button.h = button.w;
      if (type != NK_SYMBOL_NONE) {
        nk_draw_button_symbol
                  (&win->buffer,&button,&local_40,ctx->last_widget_state,&(ctx->style).combo.button,
                   type,(ctx->style).font);
        fVar7 = fVar10;
      }
      nVar1 = (ctx->style).combo.content_padding;
      fVar8 = nVar1.y;
      local_e8 = local_e8 + nVar1.x;
      r_01.w = fVar9 - (fVar8 + fVar8);
      r_01.y = fStack_e4 + fVar8;
      r_01.x = local_e8;
      r_01.h = r_01.w;
      nk_draw_image(&win->buffer,r_01,&img,(nk_color)0xffffffff);
      local_b8.padding.x = 0.0;
      local_b8.padding.y = 0.0;
      nVar1 = (ctx->style).combo.content_padding;
      fVar8 = nVar1.x;
      fVar10 = nVar1.y;
      b.x = r_01.w + local_e8 + (ctx->style).combo.spacing.x + fVar8;
      b.y = fStack_e4 + fVar10;
      b.w = (fVar7 - fVar8) - b.x;
      b.h = fVar9 - (fVar10 + fVar10);
      nk_widget_text(&win->buffer,b,selected,len,&local_b8,0x11,(ctx->style).font);
      header_00.w = header.w;
      header_00.h = header.h;
      header_00.x = header.x;
      header_00.y = header.y;
      nVar3 = nk_combo_begin(ctx,win,size,(uint)(nVar3 != 0),header_00);
    }
  }
  return nVar3;
}

Assistant:

NK_API nk_bool
nk_combo_begin_image_text(struct nk_context *ctx, const char *selected, int len,
struct nk_image img, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_style *style;
struct nk_input *in;

struct nk_rect header;
int is_clicked = nk_false;
enum nk_widget_layout_states s;
const struct nk_style_item *background;
struct nk_text text;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
s = nk_widget(&header, ctx);
if (!s) return 0;

in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
is_clicked = nk_true;

/* draw combo box header background and border */
if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
background = &style->combo.active;
text.text = style->combo.label_active;
} else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
background = &style->combo.hover;
text.text = style->combo.label_hover;
} else {
background = &style->combo.normal;
text.text = style->combo.label_normal;
}
if (background->type == NK_STYLE_ITEM_IMAGE) {
text.background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
text.background = background->data.color;
nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
}
{
struct nk_rect content;
struct nk_rect button;
struct nk_rect label;
struct nk_rect image;
int draw_button_symbol;

enum nk_symbol_type sym;
if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
sym = style->combo.sym_hover;
else if (is_clicked)
sym = style->combo.sym_active;
else sym = style->combo.sym_normal;

/* represents whether or not the combo's button symbol should be drawn */
draw_button_symbol = sym != NK_SYMBOL_NONE;

/* calculate button */
button.w = header.h - 2 * style->combo.button_padding.y;
button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
button.y = header.y + style->combo.button_padding.y;
button.h = button.w;

content.x = button.x + style->combo.button.padding.x;
content.y = button.y + style->combo.button.padding.y;
content.w = button.w - 2 * style->combo.button.padding.x;
content.h = button.h - 2 * style->combo.button.padding.y;
if (draw_button_symbol)
nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
&ctx->style.combo.button, sym, style->font);

/* draw image */
image.x = header.x + style->combo.content_padding.x;
image.y = header.y + style->combo.content_padding.y;
image.h = header.h - 2 * style->combo.content_padding.y;
image.w = image.h;
nk_draw_image(&win->buffer, image, &img, nk_white);

/* draw label */
text.padding = nk_vec2(0,0);
label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
label.y = header.y + style->combo.content_padding.y;
label.h = header.h - 2 * style->combo.content_padding.y;
if (draw_button_symbol)
label.w = (button.x - style->combo.content_padding.x) - label.x;
else
label.w = (header.x + header.w - style->combo.content_padding.x) - label.x;
nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
}
return nk_combo_begin(ctx, win, size, is_clicked, header);
}